

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O2

bool __thiscall tcmalloc::PageHeap::GetNextRange(PageHeap *this,PageID start,MallocRange *r)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  size_t sVar5;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  
  plVar3 = (long *)TCMalloc_PageMap2<35>::Next(&this->pagemap_,start);
  if (plVar3 != (long *)0x0) {
    sVar5 = plVar3[1] << 0xd;
    r->address = *plVar3 << 0xd;
    r->length = sVar5;
    r->fraction = 0.0;
    switch(*(byte *)((long)plVar3 + 0x2b) & 3) {
    case 0:
      r->type = INUSE;
      r->fraction = 1.0;
      uVar1 = *(uint *)(plVar3 + 5);
      if ((uVar1 & 0xff0000) != 0) {
        iVar2 = *(int *)((long)&DAT_0012ea44 + (ulong)(uVar1 >> 0xe & 0x3fc));
        auVar6._8_4_ = iVar2 >> 0x1f;
        auVar6._0_8_ = (long)iVar2;
        auVar6._12_4_ = 0x45300000;
        auVar4._8_4_ = (int)(sVar5 >> 0x20);
        auVar4._0_8_ = sVar5;
        auVar4._12_4_ = 0x45300000;
        r->fraction = ((double)(uVar1 & 0xffff) *
                      ((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0))) /
                      ((auVar4._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0));
      }
      break;
    case 1:
      r->type = FREE;
      break;
    case 2:
      r->type = UNMAPPED;
      break;
    case 3:
      r->type = UNKNOWN;
    }
  }
  return plVar3 != (long *)0x0;
}

Assistant:

bool PageHeap::GetNextRange(PageID start, base::MallocRange* r) {
  ASSERT(lock_.IsHeld());
  Span* span = reinterpret_cast<Span*>(pagemap_.Next(start));
  if (span == nullptr) {
    return false;
  }
  r->address = span->start << kPageShift;
  r->length = span->length << kPageShift;
  r->fraction = 0;
  switch (span->location) {
    case Span::IN_USE:
      r->type = base::MallocRange::INUSE;
      r->fraction = 1;
      if (span->sizeclass > 0) {
        // Only some of the objects in this span may be in use.
        const size_t osize = Static::sizemap()->class_to_size(span->sizeclass);
        r->fraction = (1.0 * osize * span->refcount) / r->length;
      }
      break;
    case Span::ON_NORMAL_FREELIST:
      r->type = base::MallocRange::FREE;
      break;
    case Span::ON_RETURNED_FREELIST:
      r->type = base::MallocRange::UNMAPPED;
      break;
    default:
      r->type = base::MallocRange::UNKNOWN;
      break;
  }
  return true;
}